

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  undefined1 *this_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *lhs;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  locale_ref local_500;
  unsigned_long_long local_4f8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aStack_4f0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_4e8;
  char *pcStack_4e0;
  allocator<char> local_4b9;
  undefined1 local_4b8 [8];
  memory_buffer buffer;
  undefined1 auStack_298 [8];
  format_arg arg;
  undefined1 auStack_270 [8];
  format_args args_local;
  string_view format_str_local;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_238;
  basic_string_view<char> local_228 [3];
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  string *local_1e0;
  undefined1 *local_1d0;
  string *local_1c8;
  undefined1 *local_1b8;
  string *local_1b0;
  undefined1 *local_1a0;
  string *local_198;
  undefined1 *local_188;
  string *local_180;
  __int128 local_178;
  undefined1 *local_160;
  string *local_140;
  unsigned___int128 local_138;
  undefined1 *local_120;
  string *local_100;
  undefined1 local_f1;
  undefined1 *local_f0;
  string *local_e8;
  byte local_d9;
  undefined1 *local_d8;
  string *local_d0;
  float local_c4;
  undefined1 *local_c0;
  string *local_b8;
  double local_b0;
  undefined1 *local_a8;
  string *local_a0;
  longdouble local_98;
  undefined1 *local_80;
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  string *local_60;
  undefined1 *local_58;
  basic_string_view<char> local_50;
  string *local_40;
  void *local_38;
  undefined1 *local_30;
  string *local_28;
  undefined1 *local_20;
  monostate local_11;
  string *local_10;
  
  args_local.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = args.
           super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           .desc_;
  auStack_270 = (undefined1  [8])format_str.size_;
  args_local.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )this;
  sVar2 = basic_string_view<char>::size
                    ((basic_string_view<char> *)
                     &args_local.
                      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      .field_1);
  if (sVar2 == 2) {
    lhs = basic_string_view<char>::data
                    ((basic_string_view<char> *)
                     &args_local.
                      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      .field_1);
    bVar1 = equal2(lhs,"{}");
    if (bVar1) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get((format_arg *)auStack_298,
            (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)auStack_270,0);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_298);
      if (bVar1) {
        this_00 = &buffer.field_0x216;
        local_1f0 = auStack_298;
        local_1e8 = this_00;
        local_1e0 = __return_storage_ptr__;
        switch(arg.value_.field_0.int128_value._8_4_) {
        case 0:
          break;
        case 1:
          local_1d0 = this_00;
          local_1c8 = __return_storage_ptr__;
          to_string<int,_0>(__return_storage_ptr__,auStack_298._0_4_);
          return __return_storage_ptr__;
        case 2:
          local_1b8 = this_00;
          local_1b0 = __return_storage_ptr__;
          to_string<unsigned_int,_0>(__return_storage_ptr__,auStack_298._0_4_);
          return __return_storage_ptr__;
        case 3:
          local_1a0 = this_00;
          local_198 = __return_storage_ptr__;
          to_string<long_long,_0>
                    (__return_storage_ptr__,CONCAT44(auStack_298._4_4_,auStack_298._0_4_));
          return __return_storage_ptr__;
        case 4:
          local_188 = this_00;
          local_180 = __return_storage_ptr__;
          to_string<unsigned_long_long,_0>
                    (__return_storage_ptr__,CONCAT44(auStack_298._4_4_,auStack_298._0_4_));
          return __return_storage_ptr__;
        case 5:
          local_160 = this_00;
          local_140 = __return_storage_ptr__;
          to_string<__int128,_0>(__return_storage_ptr__,&local_178);
          return __return_storage_ptr__;
        case 6:
          local_120 = this_00;
          local_100 = __return_storage_ptr__;
          to_string<unsigned___int128,_0>(__return_storage_ptr__,&local_138);
          return __return_storage_ptr__;
        case 7:
          local_f1 = auStack_298[0] & 1;
          local_f0 = this_00;
          local_e8 = __return_storage_ptr__;
          to_string<bool,_0>(__return_storage_ptr__,(bool)local_f1);
          return __return_storage_ptr__;
        case 8:
          local_d9 = auStack_298[0];
          local_d8 = this_00;
          local_d0 = __return_storage_ptr__;
          to_string<char,_0>(__return_storage_ptr__,auStack_298[0]);
          return __return_storage_ptr__;
        case 9:
          local_c0 = this_00;
          local_b8 = __return_storage_ptr__;
          to_string<float,_0>(__return_storage_ptr__,&local_c4);
          return __return_storage_ptr__;
        case 10:
          local_a8 = this_00;
          local_a0 = __return_storage_ptr__;
          to_string<double,_0>(__return_storage_ptr__,&local_b0);
          return __return_storage_ptr__;
        case 0xb:
          local_80 = this_00;
          local_78 = __return_storage_ptr__;
          to_string<long_double,_0>(__return_storage_ptr__,&local_98);
          return __return_storage_ptr__;
        case 0xc:
          local_68 = this_00;
          local_60 = __return_storage_ptr__;
          to_string<const_char_*,_0>(__return_storage_ptr__,&local_70);
          return __return_storage_ptr__;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (local_228,(char *)CONCAT44(auStack_298._4_4_,auStack_298._0_4_),
                     CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                              arg.value_.field_0.int_value._0_2_));
          local_50.data_ = local_228[0].data_;
          local_50.size_ = local_228[0].size_;
          local_58 = this_00;
          local_40 = __return_storage_ptr__;
          to_string<fmt::v7::basic_string_view<char>,_0>(__return_storage_ptr__,&local_50);
          return __return_storage_ptr__;
        case 0xe:
          local_30 = this_00;
          local_28 = __return_storage_ptr__;
          to_string<const_void_*,_0>(__return_storage_ptr__,&local_38);
          return __return_storage_ptr__;
        case 0xf:
          custom.value._4_4_ = auStack_298._4_4_;
          custom.value._0_4_ = auStack_298._0_4_;
          custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
          custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
          basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::handle::handle((handle *)&local_238,custom);
          stringifier::operator()[abi_cxx11_
                    (__return_storage_ptr__,(stringifier *)this_00,(handle)local_238);
          return __return_storage_ptr__;
        }
        local_20 = this_00;
        local_10 = __return_storage_ptr__;
        to_string<fmt::v7::monostate,_0>(__return_storage_ptr__,&local_11);
        return __return_storage_ptr__;
      }
      error_handler::on_error((error_handler *)&buffer.field_0x217,"argument not found");
    }
  }
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_4b8,&local_4b9);
  std::allocator<char>::~allocator(&local_4b9);
  local_4e8 = args_local.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1;
  local_4f8 = (unsigned_long_long)auStack_270;
  aStack_4f0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )args_local.
                 super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 .desc_;
  pcStack_4e0 = format_str.data_;
  locale_ref::locale_ref(&local_500);
  format_str_00.size_ = (size_t)pcStack_4e0;
  format_str_00.data_ = (char *)local_4e8.values_;
  args_00.field_1.args_ = aStack_4f0.args_;
  args_00.desc_ = local_4f8;
  vformat_to<char>((buffer<char> *)local_4b8,format_str_00,args_00,local_500);
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_4b8,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_4b8);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}